

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::grow
          (SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocator *pAVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  FixupPoint *pFVar7;
  long lVar8;
  uint uVar9;
  FixupPoint *pFVar10;
  ulong uVar11;
  
  uVar9 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar9) {
    uVar4 = uVar9;
  }
  pAVar3 = this->allocator;
  if (pAVar3 == (Allocator *)0x0) {
    pFVar7 = (FixupPoint *)(*(code *)NULLC::alloc)(uVar4 << 4 | 4);
    if (uVar4 != 0) {
      pFVar10 = pFVar7;
      do {
        pFVar10->cmdIndex = 0;
        pFVar10->target = (VmBlock *)0x0;
        pFVar10 = pFVar10 + 1;
      } while (pFVar10 != pFVar7 + (int)uVar4);
    }
  }
  else {
    iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,(ulong)(uVar4 << 4 | 4));
    pFVar7 = (FixupPoint *)CONCAT44(extraout_var,iVar6);
    if (uVar4 != 0) {
      pFVar10 = pFVar7;
      do {
        pFVar10->cmdIndex = 0;
        pFVar10->target = (VmBlock *)0x0;
        pFVar10 = pFVar10 + 1;
      } while (pFVar10 != pFVar7 + (int)uVar4);
    }
  }
  if (this->count != 0) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)&this->data->cmdIndex + lVar8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pFVar7->cmdIndex + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar11 < this->count);
  }
  pFVar10 = this->data;
  if (pFVar10 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pFVar10 != (FixupPoint *)0x0) {
        (*(code *)NULLC::dealloc)(pFVar10);
      }
    }
    else if (pFVar10 != (FixupPoint *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pFVar7;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}